

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O3

shared_ptr<gui::ChatBox> __thiscall
EditorInterface::debugWidgetCreation<gui::ChatBox>
          (EditorInterface *this,shared_ptr<gui::ChatBox> *widget)

{
  Editor *pEVar1;
  source_loc loc;
  level_enum lVar2;
  String *pSVar3;
  iterator iVar4;
  logger *this_00;
  mapped_type *pmVar5;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string_view_t fmt;
  shared_ptr<gui::ChatBox> sVar7;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  string local_58;
  
  lVar2 = spdlog::get_level();
  _Var6._M_pi = extraout_RDX;
  if ((int)lVar2 < 2) {
    pSVar3 = ::gui::Widget::getName((Widget *)*in_RDX);
    sf::String::operator_cast_to_string(&local_58,pSVar3);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                    *)(widget + 1),&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (((iVar4._M_node !=
          (_Base_ptr)
          &widget[1].super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount) &&
        (iVar4._M_node[2]._M_parent != (_Base_ptr)0x0)) &&
       (*(int *)&(iVar4._M_node[2]._M_parent)->_M_parent != 0)) {
      this_00 = spdlog::default_logger_raw();
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      fmt.size_ = 0x33;
      fmt.data_ = "Created widget with name \"{}\" which already exists.";
      spdlog::logger::log_<std::__cxx11::string_const&>
                (this_00,loc,warn,fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (iVar4._M_node + 1));
    }
    local_68 = (element_type *)*in_RDX;
    if (local_68 == (element_type *)0x0) {
      local_68 = (element_type *)0x0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
        }
      }
    }
    pSVar3 = ::gui::Widget::getName((Widget *)*in_RDX);
    sf::String::operator_cast_to_string(&local_58,pSVar3);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                           *)(widget + 1),&local_58);
    (pmVar5->super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_68;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar5->super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &_Stack_60);
    _Var6._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      _Var6._M_pi = extraout_RDX_01;
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
  pEVar1 = (Editor *)in_RDX[1];
  in_RDX[1] = 0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)*in_RDX;
  this->editor_ = pEVar1;
  *in_RDX = 0;
  sVar7.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  sVar7.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::ChatBox>)
         sVar7.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> EditorInterface::debugWidgetCreation(std::shared_ptr<T> widget) const {
    if (spdlog::get_level() > spdlog::level::debug) {    // FIXME: probably not ideal to check this way. check the cmake build type instead? if so, then set spdlog::level with that too.
        return widget;
    }

    const auto foundWidget = debugWidgets_.find(widget->getName());
    if (foundWidget != debugWidgets_.end() && !foundWidget->second.expired()) {
        spdlog::warn("Created widget with name \"{}\" which already exists.", foundWidget->first);
    }

    debugWidgets_[widget->getName()] = std::dynamic_pointer_cast<gui::Widget>(widget);
    return widget;
}